

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# credits.c
# Opt level: O2

void init_credits(void)

{
  bool bVar1;
  uchar uVar2;
  _Bool _Var3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  ushort **ppuVar11;
  TEXT_LIST *pTVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  char *__dest;
  CREDIT_NAME *pCVar16;
  uchar c;
  README_SECTION *pRVar17;
  README_SECTION *pRVar18;
  uchar *__s1;
  undefined8 *__ptr;
  uchar *puVar19;
  undefined1 *puVar20;
  uint uVar21;
  undefined8 *puVar22;
  int iVar23;
  uchar *puVar24;
  CREDIT_NAME *pCVar25;
  CREDIT_NAME **ppCVar26;
  bool bVar27;
  README_SECTION sect [1];
  uchar local_138 [264];
  
  text_pix = 0;
  text_scroll = 0;
  cred = (CREDIT_NAME *)0x0;
  credit_width = 0;
  credit_scroll = 0;
  text_char = 0xffff;
  credit_age = 0;
  sect[0].flat = (char *)0x0;
  sect[0].desc = "Introduction";
  sect[0].head._0_4_ = 0;
  sect[0].head._4_4_ = 0;
  sect[0].tail._0_4_ = 0;
  sect[0].tail._4_4_ = 0;
  uVar5 = al_ustr_newf("%s/readme.txt",data_path);
  uVar6 = al_cstr(uVar5);
  lVar7 = al_fopen(uVar6,"r");
  al_ustr_free(uVar5);
  if (lVar7 == 0) {
    title_text = "Can\'t find readme.txt, so this scroller is empty.                ";
    title_size = 0x41;
    title_alloced = 0;
  }
  else {
    bVar27 = true;
    pRVar18 = (README_SECTION *)0x0;
    while (pRVar17 = pRVar18, lVar8 = al_fgets(lVar7,local_138,0x100), lVar8 != 0) {
      if (local_138[0] == '=') {
        pcVar9 = strchr((char *)local_138,0x20);
        pRVar18 = pRVar17;
        if (pcVar9 != (char *)0x0) {
          sVar10 = strlen(pcVar9);
          while( true ) {
            sVar10 = (size_t)((int)sVar10 + -1);
            uVar2 = pcVar9[sVar10];
            _Var3 = safe_isspace(uVar2);
            if ((~_Var3 & uVar2 != '=') != 0) break;
            pcVar9[sVar10] = '\0';
          }
          iVar4 = my_stricmp(pcVar9 + 1,sect[0].desc);
          pRVar18 = (README_SECTION *)0x0;
          if (iVar4 == 0) {
            pRVar18 = sect;
          }
          bVar27 = true;
        }
      }
      else {
        puVar24 = local_138;
        uVar2 = local_138[0];
        pRVar18 = (README_SECTION *)0x0;
        if (pRVar17 != (README_SECTION *)0x0) {
          while ((uVar2 != '\0' && (_Var3 = safe_isspace(uVar2), _Var3))) {
            puVar19 = puVar24 + 1;
            puVar24 = puVar24 + 1;
            uVar2 = *puVar19;
          }
          sVar10 = strlen((char *)puVar24);
          while( true ) {
            sVar10 = sVar10 - 1;
            if ((int)(uint)sVar10 < 0) break;
            uVar21 = (uint)sVar10 & 0x7fffffff;
            ppuVar11 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar11 + (long)(char)puVar24[uVar21] * 2 + 1) & 0x20) == 0)
            break;
            puVar24[uVar21] = '\0';
          }
          if ((*puVar24 != '\0') || (bVar1 = !bVar27, bVar27 = true, pRVar18 = pRVar17, bVar1)) {
            pTVar12 = (TEXT_LIST *)malloc(0x10);
            pTVar12->next = (TEXT_LIST *)0x0;
            sVar10 = strlen((char *)puVar24);
            pcVar9 = (char *)malloc(sVar10 + 1);
            pTVar12->text = pcVar9;
            strcpy(pcVar9,(char *)puVar24);
            pRVar18 = (README_SECTION *)&pRVar17->tail->next;
            if (pRVar17->tail == (TEXT_LIST *)0x0) {
              pRVar18 = pRVar17;
            }
            pRVar18->head = pTVar12;
            pRVar17->tail = pTVar12;
            bVar27 = *puVar24 == '\0';
            pRVar18 = pRVar17;
          }
        }
      }
    }
    al_fclose(lVar7);
    sVar10 = strlen(load_text_intro_msg);
    iVar4 = (int)sVar10;
    __ptr = (undefined8 *)CONCAT44(sect[0].head._4_4_,sect[0].head._0_4_);
    pcVar9 = sect[0].flat;
    if (__ptr != (undefined8 *)0x0) {
      iVar23 = 0;
      title_size = iVar4;
      for (puVar22 = __ptr; puVar22 != (undefined8 *)0x0; puVar22 = (undefined8 *)puVar22[1]) {
        puVar20 = (undefined1 *)*puVar22;
        if (*puVar20 == '\0') {
          puVar20 = load_text_splitter;
        }
        sVar10 = strlen(puVar20);
        iVar23 = iVar23 + (int)sVar10 + 1;
      }
      pcVar9 = (char *)malloc((long)(iVar23 + 1));
      *pcVar9 = '\0';
      for (puVar22 = __ptr; puVar22 != (undefined8 *)0x0; puVar22 = (undefined8 *)puVar22[1]) {
        puVar20 = (undefined1 *)*puVar22;
        if (*puVar20 == '\0') {
          puVar20 = load_text_splitter;
        }
        strcat(pcVar9,puVar20);
        sVar10 = strlen(pcVar9);
        (pcVar9 + sVar10)[0] = ' ';
        (pcVar9 + sVar10)[1] = '\0';
      }
      sect[0].flat = pcVar9;
      sVar10 = strlen(pcVar9);
      sVar13 = strlen(sect[0].desc);
      sVar14 = strlen(load_text_splitter);
      sVar15 = strlen(load_text_marker);
      iVar4 = iVar4 + (int)sVar14 + (int)sVar10 + (int)sVar13 + (int)sVar15 * 2 + 2;
    }
    title_size = iVar4;
    __dest = (char *)malloc((long)(iVar4 + 1));
    title_alloced = 1;
    title_text = __dest;
    strcpy(__dest,load_text_intro_msg);
    if (pcVar9 != (char *)0x0) {
      strcat(__dest,load_text_marker);
      sVar10 = strlen(__dest);
      (__dest + sVar10)[0] = ' ';
      (__dest + sVar10)[1] = '\0';
      strcat(__dest,sect[0].desc);
      sVar10 = strlen(__dest);
      (__dest + sVar10)[0] = ' ';
      (__dest + sVar10)[1] = '\0';
      strcat(__dest,load_text_marker);
      strcat(__dest,load_text_splitter);
      strcat(__dest,pcVar9);
    }
    while (__ptr != (undefined8 *)0x0) {
      free((void *)*__ptr);
      puVar22 = (undefined8 *)__ptr[1];
      free(__ptr);
      __ptr = puVar22;
    }
    free(sect[0].flat);
  }
  uVar5 = al_ustr_newf("%s/%s",data_path,"thanks.txt");
  uVar6 = al_cstr(uVar5);
  lVar7 = al_fopen(uVar6,"r");
  al_ustr_free(uVar5);
  if (lVar7 != 0) {
    pCVar16 = (CREDIT_NAME *)0x0;
    while ((pCVar25 = pCVar16, lVar8 = al_fgets(lVar7,local_138,0x100), lVar8 != 0 &&
           (iVar4 = my_stricmp((char *)local_138,"Thanks!"), iVar4 != 0))) {
      while (pcVar9 = strstr((char *)local_138,"&lt"), pcVar9 != (char *)0x0) {
        *pcVar9 = '<';
        sVar10 = strlen(pcVar9 + 2);
        memmove(pcVar9 + 1,pcVar9 + 3,sVar10);
      }
      while (pcVar9 = strstr((char *)local_138,"&gt"), pcVar9 != (char *)0x0) {
        *pcVar9 = '>';
        sVar10 = strlen(pcVar9 + 2);
        memmove(pcVar9 + 1,pcVar9 + 3,sVar10);
      }
      puVar20 = (undefined1 *)((long)&sect[0].desc + 7);
      puVar24 = local_138;
      while ((uVar2 = *puVar24, puVar19 = puVar24, c = uVar2, uVar2 != '\0' &&
             (_Var3 = safe_isspace(uVar2), _Var3))) {
        puVar24 = puVar24 + 1;
        puVar20 = puVar20 + 1;
      }
      do {
        __s1 = puVar19;
        if (c == '\0') break;
        _Var3 = safe_isspace(c);
        puVar19 = __s1 + 1;
        c = __s1[1];
      } while (__s1[1] != '(' || !_Var3);
      iVar4 = strncmp((char *)__s1," (<email>",9);
      if ((iVar4 == 0) || (iVar4 = strncmp((char *)__s1," (email",7), iVar4 == 0)) {
        *__s1 = '\0';
        pCVar16 = (CREDIT_NAME *)malloc(0x18);
        sVar10 = strlen((char *)puVar24);
        pcVar9 = (char *)malloc(sVar10 + 1);
        pCVar16->name = pcVar9;
        strcpy(pcVar9,(char *)puVar24);
        pCVar16->text = (char *)0x0;
        pCVar16->next = credits;
        credits = pCVar16;
      }
      else if (uVar2 == '\0') {
        pCVar16 = (CREDIT_NAME *)0x0;
      }
      else {
        pCVar16 = (CREDIT_NAME *)0x0;
        if (pCVar25 != (CREDIT_NAME *)0x0) {
          sVar10 = strlen((char *)puVar24);
          puVar19 = puVar20 + sVar10;
          while ((puVar24 < puVar19 && (_Var3 = safe_isspace(*puVar19), _Var3))) {
            *puVar19 = '\0';
            puVar19 = puVar19 + -1;
          }
          pcVar9 = pCVar25->text;
          pCVar16 = pCVar25;
          if (pcVar9 == (char *)0x0) {
            sVar10 = strlen((char *)puVar24);
            pcVar9 = (char *)malloc(sVar10 + 1);
            pCVar25->text = pcVar9;
            strcpy(pcVar9,(char *)puVar24);
          }
          else {
            sVar10 = strlen(pcVar9);
            sVar13 = strlen((char *)puVar24);
            pcVar9 = (char *)realloc(pcVar9,sVar10 + sVar13 + 2);
            pCVar25->text = pcVar9;
            sVar10 = strlen(pcVar9);
            (pcVar9 + sVar10)[0] = ' ';
            (pcVar9 + sVar10)[1] = '\0';
            strcat(pcVar9,(char *)puVar24);
          }
        }
      }
    }
    al_fclose(lVar7);
    ppCVar26 = &credits;
    bVar27 = true;
    do {
      while ((pCVar16 = *ppCVar26, pCVar16 != (CREDIT_NAME *)0x0 &&
             (pCVar16->next != (CREDIT_NAME *)0x0))) {
        iVar4 = my_stricmp(pCVar16->name,pCVar16->next->name);
        if (0 < iVar4) {
          pCVar25 = pCVar16->next;
          *ppCVar26 = pCVar25;
          pCVar16->next = pCVar25->next;
          (*ppCVar26)->next = pCVar16;
          pCVar16 = *ppCVar26;
          bVar27 = false;
        }
        ppCVar26 = &pCVar16->next;
      }
      ppCVar26 = &credits;
      bVar1 = !bVar27;
      bVar27 = true;
    } while (bVar1);
  }
  return;
}

Assistant:

void init_credits(void)
{
   /* for the text scroller */
   text_char = 0xFFFF;
   text_width = 0;
   text_pix = 0;
   text_scroll = 0;

   /* for the credits display */
   cred = NULL;
   credit_width = 0;
   credit_scroll = 0;
   credit_age = 0;
   credit_speed = 32;
   credit_skip = 1;

   load_text();
   load_credits();
}